

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::openEntry(Impl *this,String *name,WriteMode mode)

{
  size_t *this_00;
  bool bVar1;
  String *name_00;
  EntryImpl *__y;
  pointer ppVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var4;
  ArrayPtr<const_char> local_110;
  undefined4 local_fc;
  _Base_ptr local_f8;
  undefined1 local_f0;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_e8;
  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>
  local_98;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  insertResult;
  undefined1 local_78 [8];
  StringPtr nameRef;
  EntryImpl entry;
  WriteMode mode_local;
  String *name_local;
  Impl *this_local;
  
  bVar1 = has<kj::WriteMode,void>(mode,CREATE);
  if (bVar1) {
    name_00 = mv<kj::String>(name);
    this_00 = &nameRef.content.size_;
    EntryImpl::EntryImpl((EntryImpl *)this_00,name_00);
    StringPtr::StringPtr((StringPtr *)local_78,(String *)this_00);
    __y = mv<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                    ((EntryImpl *)&nameRef.content.size_);
    std::make_pair<kj::StringPtr&,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
              (&local_e8,(StringPtr *)local_78,__y);
    _Var4 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                        *)&this->entries,&local_e8);
    local_f8 = (_Base_ptr)_Var4.first._M_node;
    local_f0 = _Var4.second;
    local_98._M_node = local_f8;
    insertResult.first._M_node._0_1_ = local_f0;
    std::pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>::~pair
              (&local_e8);
    if ((((byte)insertResult.first._M_node & 1) != 0) ||
       (bVar1 = has<kj::WriteMode,void>(mode,MODIFY), bVar1)) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>
               ::operator->(&local_98);
      Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::Maybe
                ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)&this_local,
                 &ppVar2->second);
    }
    else {
      Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::Maybe
                ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)&this_local,
                 (void *)0x0);
    }
    local_fc = 1;
    EntryImpl::~EntryImpl((EntryImpl *)&nameRef.content.size_);
    return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this_local
    ;
  }
  bVar1 = has<kj::WriteMode,void>(mode,MODIFY);
  if (!bVar1) {
    Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>::Maybe
              ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)&this_local,
               (void *)0x0);
    return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this_local
    ;
  }
  StringPtr::StringPtr((StringPtr *)&local_110,name);
  MVar3 = tryGetEntry(this,(StringPtr)local_110);
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)MVar3.ptr;
}

Assistant:

Maybe<EntryImpl&> openEntry(String&& name, WriteMode mode) {
      if (has(mode, WriteMode::CREATE)) {
        EntryImpl entry(kj::mv(name));
        StringPtr nameRef = entry.name;
        auto insertResult = entries.insert(std::make_pair(nameRef, kj::mv(entry)));

        if (!insertResult.second && !has(mode, WriteMode::MODIFY)) {
          // Entry already existed and MODIFY not specified.
          return nullptr;
        }

        return insertResult.first->second;
      } else if (has(mode, WriteMode::MODIFY)) {
        return tryGetEntry(name);
      } else {
        // Neither CREATE nor MODIFY specified: precondition always fails.
        return nullptr;
      }
    }